

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O2

int get_mean_dev_features(int16_t *data,int stride,int bw,int bh,float *features)

{
  int iVar1;
  int64_t iVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  float *pfVar7;
  long lVar8;
  int iVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  uint in_XMM2_Db;
  uint in_XMM2_Dc;
  uint in_XMM2_Dd;
  uint in_XMM3_Db;
  uint in_XMM3_Dc;
  uint in_XMM3_Dd;
  float local_f0;
  int local_ec;
  double local_e8;
  int x_sum;
  undefined8 local_b8;
  uint uStack_b0;
  uint uStack_ac;
  float local_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  float *local_90;
  float *local_88;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  int16_t *local_60;
  long local_58;
  long local_50;
  double local_48;
  long local_40;
  int64_t x2_sum;
  
  iVar5 = bh >> (bw <= bh);
  iVar6 = bw >> (bh <= bw);
  local_48 = (double)(iVar6 * iVar5);
  local_50 = (long)iVar6;
  local_40 = (long)bw;
  local_78 = (long)iVar5;
  local_70 = (long)bh;
  local_88 = features + 1;
  local_80 = stride * local_78 * 2;
  local_58 = local_50 * 2;
  fVar10 = 2.8026e-45;
  local_e8 = 0.0;
  local_f0 = 0.0;
  lVar3 = 0;
  iVar9 = 0;
  lVar4 = 0;
  local_ec = 0;
  local_90 = features;
  while( true ) {
    pfVar7 = local_90;
    if (local_70 <= lVar3) break;
    pfVar7 = local_88 + (int)fVar10;
    local_68 = lVar3;
    local_60 = data;
    for (lVar8 = 0; lVar8 < local_40; lVar8 = lVar8 + local_50) {
      local_b8 = data;
      local_a8 = fVar10;
      (*aom_get_blk_sse_sum)(data,stride,iVar6,iVar5,&x_sum,&x2_sum);
      iVar2 = x2_sum;
      iVar1 = x_sum;
      fVar14 = (float)x_sum / (float)(iVar6 * iVar5);
      fVar12 = (float)((double)x2_sum / local_48) - fVar14 * fVar14;
      fVar10 = 0.0;
      in_XMM3_Db = in_XMM2_Db;
      in_XMM3_Dc = in_XMM2_Dc;
      in_XMM3_Dd = in_XMM2_Dd;
      if (0.0 < fVar12) {
        if (fVar12 < 0.0) {
          fVar10 = sqrtf(fVar12);
          in_XMM3_Db = 0;
          in_XMM3_Dc = 0;
          in_XMM3_Dd = 0;
        }
        else {
          fVar10 = SQRT(fVar12);
        }
      }
      local_ec = local_ec + iVar1;
      lVar4 = lVar4 + iVar2;
      pfVar7[-1] = fVar14;
      *pfVar7 = fVar10;
      in_XMM2_Dc = 0;
      in_XMM2_Dd = 0;
      local_e8 = local_e8 + (double)(fVar14 * fVar14);
      in_XMM2_Db = (uint)((ulong)local_e8 >> 0x20);
      local_f0 = local_f0 + fVar10;
      iVar9 = iVar9 + 1;
      fVar10 = (float)((int)local_a8 + 2);
      pfVar7 = pfVar7 + 2;
      data = (int16_t *)((long)local_b8 + local_58);
    }
    lVar3 = local_68 + local_78;
    data = (int16_t *)((long)local_60 + local_80);
  }
  fVar14 = (float)local_ec / (float)(bh * bw);
  *local_90 = fVar14;
  fVar12 = -fVar14;
  fVar11 = (float)lVar4 / (float)(bh * bw) - fVar14 * fVar14;
  fVar13 = 0.0;
  if (0.0 < fVar11) {
    if (fVar11 < 0.0) {
      local_b8 = (int16_t *)CONCAT44(in_XMM3_Db,fVar14);
      uStack_b0 = in_XMM3_Dc;
      uStack_ac = in_XMM3_Dd;
      local_a8 = fVar12;
      uStack_a4 = in_XMM3_Db ^ 0x80000000;
      uStack_a0 = in_XMM3_Dc ^ 0x80000000;
      uStack_9c = in_XMM3_Dd ^ 0x80000000;
      fVar13 = sqrtf(fVar11);
      fVar12 = local_a8;
      fVar14 = (float)local_b8;
    }
    else {
      fVar13 = SQRT(fVar11);
    }
  }
  fVar11 = 0.0;
  pfVar7[1] = fVar13;
  fVar12 = fVar12 * fVar14 + (float)(local_e8 / (double)iVar9);
  if (0.0 < fVar12) {
    if (fVar12 < 0.0) {
      fVar11 = sqrtf(fVar12);
    }
    else {
      fVar11 = SQRT(fVar12);
    }
  }
  pfVar7[(int)fVar10] = fVar11;
  pfVar7[(long)(int)fVar10 + 1] = local_f0 / (float)iVar9;
  return (int)fVar10 + 2;
}

Assistant:

static inline int get_mean_dev_features(const int16_t *data, int stride, int bw,
                                        int bh, float *features) {
  const int16_t *const data_ptr = &data[0];
  const int subh = (bh >= bw) ? (bh >> 1) : bh;
  const int subw = (bw >= bh) ? (bw >> 1) : bw;
  const int num = bw * bh;
  const int sub_num = subw * subh;
  int feature_idx = 2;
  int total_x_sum = 0;
  int64_t total_x2_sum = 0;
  int num_sub_blks = 0;
  double mean2_sum = 0.0f;
  float dev_sum = 0.0f;

  for (int row = 0; row < bh; row += subh) {
    for (int col = 0; col < bw; col += subw) {
      int x_sum;
      int64_t x2_sum;
      // TODO(any): Write a SIMD version. Clear registers.
      aom_get_blk_sse_sum(data_ptr + row * stride + col, stride, subw, subh,
                          &x_sum, &x2_sum);
      total_x_sum += x_sum;
      total_x2_sum += x2_sum;

      const float mean = (float)x_sum / sub_num;
      const float dev = get_dev(mean, (double)x2_sum, sub_num);
      features[feature_idx++] = mean;
      features[feature_idx++] = dev;
      mean2_sum += (double)(mean * mean);
      dev_sum += dev;
      num_sub_blks++;
    }
  }

  const float lvl0_mean = (float)total_x_sum / num;
  features[0] = lvl0_mean;
  features[1] = get_dev(lvl0_mean, (double)total_x2_sum, num);

  // Deviation of means.
  features[feature_idx++] = get_dev(lvl0_mean, mean2_sum, num_sub_blks);
  // Mean of deviations.
  features[feature_idx++] = dev_sum / num_sub_blks;

  return feature_idx;
}